

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O0

void __thiscall
gimage::ImageIO::load(ImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  int iVar1;
  BasicImageIO *pBVar2;
  uint in_ECX;
  char *in_RDX;
  char *in_RSI;
  ImageIO *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  exception *anon_var_0;
  size_t pos;
  string s;
  long in_stack_00000468;
  long in_stack_00000470;
  int in_stack_0000047c;
  char *in_stack_00000480;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_00000488;
  BasicImageIO *in_stack_00000490;
  long in_stack_000004a0;
  long in_stack_000004a8;
  ulong local_78;
  allocator local_59;
  string local_58 [32];
  undefined8 local_38;
  undefined8 local_30;
  uint local_24;
  char *pcVar3;
  bool reading;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  pcVar3 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,in_RDX,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_78 = std::__cxx11::string::rfind((char)local_58,0x3a);
  if (local_78 != 0xffffffffffffffff) {
    iVar1 = std::__cxx11::string::compare((ulong)local_58,local_78,(char *)0x2);
    if (iVar1 == 0) {
      local_78 = 0xffffffffffffffff;
    }
  }
  reading = SUB81((ulong)pcVar3 >> 0x38,0);
  if (local_78 == 0xffffffffffffffff) {
    pBVar2 = getBasicImageIO(in_RDI,in_RSI,reading);
    (*pBVar2->_vptr_BasicImageIO[6])
              (pBVar2,in_RSI,pcVar3,(ulong)local_24,local_30,local_38,in_stack_00000008,
               in_stack_00000010);
  }
  else {
    getBasicImageIO(in_RDI,in_RSI,reading);
    anon_unknown_17::loadTiled<unsigned_char>
              (in_stack_00000490,in_stack_00000488,in_stack_00000480,in_stack_0000047c,
               in_stack_00000470,in_stack_00000468,in_stack_000004a0,in_stack_000004a8);
  }
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void ImageIO::load(ImageU8 &image, const char *name, int ds, long x, long y,
                   long w, long h) const
{
  std::string s=name;
  size_t pos=s.rfind(':');

  if (pos != s.npos && s.compare(pos, 2, ":\\") == 0)
  {
    pos=s.npos;
  }

  if (pos == s.npos)
  {
    getBasicImageIO(name, true).load(image, name, ds, x, y, w, h);
  }
  else
  {
    try
    {
      loadTiled(getBasicImageIO(name, true), image, name, ds, x, y, w, h);
    }
    catch (const std::exception &)
    {
      // if loading as tiled image fails, try loading as image with colon in file name
      getBasicImageIO(name, true).load(image, name, ds, x, y, w, h);
    }
  }
}